

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O2

void Dss_NtkTransform(Dss_Ntk_t *p,int *pPermDsd)

{
  Dss_Obj_t *pDVar1;
  Dss_Obj_t *pDVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int nPerms;
  int *local_a0;
  Dss_Obj_t *pChildren [12];
  
  if ((*(uint *)(((ulong)p->pRoot & 0xfffffffffffffffe) + 4) & 7) != 1) {
    local_a0 = pPermDsd;
    for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
      pDVar1 = (Dss_Obj_t *)Vec_PtrEntry(p->vObjs,iVar5);
      uVar3 = *(uint *)&pDVar1->field_0x4;
      if ((6 < (uVar3 & 7)) || ((0x66U >> (uVar3 & 7) & 1) == 0)) {
        uVar4 = 0;
        while( true ) {
          uVar3 = uVar3 >> 0x1b;
          if (uVar3 <= uVar4) break;
          pDVar2 = Dss_ObjChild(p->vObjs,pDVar1,(int)uVar4);
          uVar3 = *(uint *)&pDVar1->field_0x4;
          if (pDVar2 == (Dss_Obj_t *)0x0) {
            uVar3 = uVar3 >> 0x1b;
            break;
          }
          pChildren[uVar4] = pDVar2;
          uVar4 = uVar4 + 1;
        }
        Dss_ObjSort(p->vObjs,pChildren,uVar3,(int *)0x0);
        for (uVar4 = 0; uVar4 < *(uint *)&pDVar1->field_0x4 >> 0x1b; uVar4 = uVar4 + 1) {
          uVar3 = Dss_Obj2Lit(pChildren[uVar4]);
          (&pDVar1[1].Id)[uVar4] = uVar3;
        }
      }
    }
    nPerms = 0;
    iVar5 = Dss_NtkCollectPerm_rec(p,p->pRoot,local_a0,&nPerms);
    pDVar1 = p->pRoot;
    if (iVar5 != 0) {
      pDVar1 = (Dss_Obj_t *)((ulong)pDVar1 & 0xfffffffffffffffe);
      p->pRoot = pDVar1;
    }
    if (nPerms != (*(uint *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) >> 3 & 0xff)) {
      __assert_fail("nPerms == (int)Dss_Regular(p->pRoot)->nSupp",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                    ,0x2e9,"void Dss_NtkTransform(Dss_Ntk_t *, int *)");
    }
  }
  return;
}

Assistant:

void Dss_NtkTransform( Dss_Ntk_t * p, int * pPermDsd )
{
    Dss_Obj_t * pChildren[DAU_MAX_VAR];
    Dss_Obj_t * pObj, * pChild;
    int i, k, nPerms;
    if ( Dss_Regular(p->pRoot)->Type == DAU_DSD_CONST0 )
        return;
    Dss_VecForEachNode( p->vObjs, pObj, i )
    {
        if ( pObj->Type == DAU_DSD_MUX || pObj->Type == DAU_DSD_PRIME )
            continue;
        Dss_ObjForEachChild( p->vObjs, pObj, pChild, k )
            pChildren[k] = pChild;
        Dss_ObjSort( p->vObjs, pChildren, Dss_ObjFaninNum(pObj), NULL );
        for ( k = 0; k < Dss_ObjFaninNum(pObj); k++ )
            pObj->pFans[k] = Dss_Obj2Lit( pChildren[k] );
    }
    nPerms = 0;
    if ( Dss_NtkCollectPerm_rec( p, p->pRoot, pPermDsd, &nPerms ) )
        p->pRoot = Dss_Regular(p->pRoot);
    assert( nPerms == (int)Dss_Regular(p->pRoot)->nSupp );
}